

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChild(char *str_id,ImVec2 *size_arg,bool border,ImGuiWindowFlags extra_flags)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  float fVar3;
  char local_148 [7];
  bool ret;
  char title [256];
  ImVec2 local_3c;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindowFlags flags;
  ImGuiWindow *window;
  ImGuiWindowFlags extra_flags_local;
  bool border_local;
  ImVec2 *size_arg_local;
  char *str_id_local;
  
  pIVar2 = GetCurrentWindow();
  content_avail.x = 1.469731e-39;
  size = GetContentRegionAvail();
  title._248_8_ = *size_arg;
  local_3c = ImFloor((ImVec2)title._248_8_);
  if (local_3c.x <= 0.0) {
    if ((local_3c.x == 0.0) && (!NAN(local_3c.x))) {
      content_avail.x = 4.408467e-39;
    }
    fVar3 = ImMax(size.x,4.0);
    local_3c.x = fVar3 - ABS(local_3c.x);
  }
  if (local_3c.y <= 0.0) {
    if ((local_3c.y == 0.0) && (!NAN(local_3c.y))) {
      content_avail.x = (float)((uint)content_avail.x | 0x400000);
    }
    fVar3 = ImMax(size.y,4.0);
    local_3c.y = fVar3 - ABS(local_3c.y);
  }
  if (border) {
    content_avail.x = (float)((uint)content_avail.x | 0x80);
  }
  ImFormatString(local_148,0x100,"%s.%s",pIVar2->Name,str_id);
  bVar1 = Begin(local_148,(bool *)0x0,&local_3c,-1.0,extra_flags | (uint)content_avail.x);
  if ((pIVar2->Flags & 0x80U) == 0) {
    pIVar2 = GetCurrentWindow();
    pIVar2->Flags = pIVar2->Flags & 0xffffff7f;
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginChild(const char* str_id, const ImVec2& size_arg, bool border, ImGuiWindowFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_ChildWindow;

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
    {
        if (size.x == 0.0f)
            flags |= ImGuiWindowFlags_ChildWindowAutoFitX;
        size.x = ImMax(content_avail.x, 4.0f) - fabsf(size.x); // Arbitrary minimum zero-ish child size of 4.0f (0.0f causing too much issues)
    }
    if (size.y <= 0.0f)
    {
        if (size.y == 0.0f)
            flags |= ImGuiWindowFlags_ChildWindowAutoFitY;
        size.y = ImMax(content_avail.y, 4.0f) - fabsf(size.y);
    }
    if (border)
        flags |= ImGuiWindowFlags_ShowBorders;
    flags |= extra_flags;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s.%s", window->Name, str_id);

    bool ret = ImGui::Begin(title, NULL, size, -1.0f, flags);

    if (!(window->Flags & ImGuiWindowFlags_ShowBorders))
        GetCurrentWindow()->Flags &= ~ImGuiWindowFlags_ShowBorders;

    return ret;
}